

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool __thiscall
peparse::readCString(peparse *this,bounded_buffer *buffer,uint32_t off,string *result)

{
  uchar *puVar1;
  undefined4 in_register_00000014;
  string *psVar2;
  long lVar3;
  uchar *puVar4;
  bool bVar5;
  
  psVar2 = (string *)CONCAT44(in_register_00000014,off);
  if ((uint)buffer < *(uint *)(this + 8)) {
    lVar3 = ((ulong)buffer & 0xffffffff) + *(long *)this;
    puVar4 = (uchar *)((ulong)*(uint *)(this + 8) + *(long *)this);
    puVar1 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (lVar3,puVar4);
    bVar5 = puVar1 != puVar4;
    if (bVar5) {
      std::__cxx11::string::_M_replace_dispatch<unsigned_char*>
                (psVar2,*(long *)psVar2 + *(long *)(psVar2 + 8),
                 *(long *)psVar2 + *(long *)(psVar2 + 8),lVar3,puVar1);
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool
readCString(const bounded_buffer &buffer, std::uint32_t off, string &result) {
  if (off < buffer.bufLen) {
    std::uint8_t *p = buffer.buf;
    std::uint32_t n = buffer.bufLen;
    std::uint8_t *b = p + off;
    std::uint8_t *x = std::find(b, p + n, 0);

    if (x == p + n) {
      return false;
    }

    result.insert(result.end(), b, x);
    return true;
  }
  return false;
}